

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.h
# Opt level: O1

void __thiscall
gpu::ColorSpaceFilters<unsigned_char>::sepia
          (ColorSpaceFilters<unsigned_char> *this,uchar *pixelR,uchar *pixelG,uchar *pixelB,
          uchar *pixelOutputR,uchar *pixelOutputG,uchar *pixelOutputB)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = (float)*pixelB * 0.05 + (float)*pixelR * 0.6 + (float)*pixelG * 0.35;
  fVar1 = fVar2 * 1.25;
  fVar3 = 255.0;
  if ((fVar1 <= 255.0) && (fVar3 = fVar1, fVar1 < 0.0)) {
    fVar3 = 0.0;
  }
  fVar2 = fVar2 * 1.05;
  *pixelOutputR = (uchar)(int)fVar3;
  fVar3 = 255.0;
  if ((fVar2 <= 255.0) && (fVar3 = fVar2, fVar2 < 0.0)) {
    fVar3 = 0.0;
  }
  *pixelOutputG = (uchar)(int)fVar3;
  fVar2 = 255.0;
  if ((fVar1 <= 255.0) && (fVar2 = fVar1, fVar1 < 0.0)) {
    fVar2 = 0.0;
  }
  *pixelOutputB = (uchar)(int)fVar2;
  return;
}

Assistant:

FUNCTION_PREFIX void ColorSpaceFilters<T>::sepia(T &pixelR, T &pixelG,T &pixelB,T &pixelOutputR,
                                                     T &pixelOutputG,T &pixelOutputB)                       
    {
      /**
       * Filter can be implemented inplace 
       * BW filter is basically 0.6*R + 0.35*G + 0.5*B
       * sepia we basically add some in RedChannel, and siginficantly less in Green Channel
       * */
      float value = 0.6*pixelR + 0.35*pixelG + 0.05*pixelB;
      //pixelOutputR=pixelOutputG=pixelOutputB=value;

			float temp = 1.25 * value;
      PIXEL_DOMAIN_CHECK(temp);
      pixelOutputR = temp;

      temp = 1.05 * value;
      PIXEL_DOMAIN_CHECK(temp);
      pixelOutputG = temp;

      temp = 1.25 * value;
      PIXEL_DOMAIN_CHECK(temp);
      pixelOutputB = temp;
    }